

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O1

int EmitRescaledAlphaRGB(VP8Io *io,WebPDecParams *p,int expected_num_out_lines)

{
  int iVar1;
  WebPRescaler *rescaler;
  bool bVar2;
  int iVar3;
  int lines_left;
  int iVar4;
  int iVar5;
  
  if ((io->a != (uint8_t *)0x0) && (0 < expected_num_out_lines)) {
    rescaler = p->scaler_a;
    iVar1 = p->last_y;
    iVar4 = expected_num_out_lines;
    do {
      iVar3 = rescaler->src_y;
      WebPRescalerImport(rescaler,(io->mb_y - iVar3) + io->mb_h,
                         io->a + ((long)iVar3 - (long)io->mb_y) * (long)io->width,io->width);
      iVar3 = (*p->emit_alpha_row)(p,(iVar1 + expected_num_out_lines) - iVar4,iVar4);
      iVar5 = iVar4 - iVar3;
      bVar2 = iVar3 <= iVar4;
      iVar4 = iVar5;
    } while (iVar5 != 0 && bVar2);
  }
  return 0;
}

Assistant:

static int EmitRescaledAlphaRGB(const VP8Io* const io, WebPDecParams* const p,
                                int expected_num_out_lines) {
  if (io->a != NULL) {
    WebPRescaler* const scaler = p->scaler_a;
    int lines_left = expected_num_out_lines;
    const int y_end = p->last_y + lines_left;
    while (lines_left > 0) {
      const int64_t row_offset = (ptrdiff_t)scaler->src_y - io->mb_y;
      WebPRescalerImport(scaler, io->mb_h + io->mb_y - scaler->src_y,
                         io->a + row_offset * io->width, io->width);
      lines_left -= p->emit_alpha_row(p, y_end - lines_left, lines_left);
    }
  }
  return 0;
}